

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O1

ContiguousMemoryRange __thiscall
protozero::ScatteredHeapBuffer::GetNewBuffer(ScatteredHeapBuffer *this)

{
  ScatteredStreamWriter *pSVar1;
  pointer pSVar2;
  _Head_base<0UL,_unsigned_char_*,_false> _Var3;
  ulong uVar4;
  uint8_t *extraout_RDX;
  uint8_t *puVar5;
  ContiguousMemoryRange CVar6;
  ContiguousMemoryRange CVar7;
  
  pSVar1 = this->writer_;
  if (pSVar1 != (ScatteredStreamWriter *)0x0) {
    pSVar2 = (this->slices_).
             super__Vector_base<protozero::ScatteredHeapBuffer::Slice,_std::allocator<protozero::ScatteredHeapBuffer::Slice>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if ((this->slices_).
        super__Vector_base<protozero::ScatteredHeapBuffer::Slice,_std::allocator<protozero::ScatteredHeapBuffer::Slice>_>
        ._M_impl.super__Vector_impl_data._M_start != pSVar2) {
      pSVar2[-1].unused_bytes_ = (long)(pSVar1->cur_range_).end - (long)pSVar1->write_ptr_;
    }
    if ((this->cached_slice_).buffer_._M_t.
        super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
        super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
        super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl == (uchar *)0x0) {
      std::
      vector<protozero::ScatteredHeapBuffer::Slice,std::allocator<protozero::ScatteredHeapBuffer::Slice>>
      ::emplace_back<unsigned_long&>
                ((vector<protozero::ScatteredHeapBuffer::Slice,std::allocator<protozero::ScatteredHeapBuffer::Slice>>
                  *)&this->slices_,&this->next_slice_size_);
    }
    else {
      perfetto::std::
      vector<protozero::ScatteredHeapBuffer::Slice,_std::allocator<protozero::ScatteredHeapBuffer::Slice>_>
      ::emplace_back<protozero::ScatteredHeapBuffer::Slice>(&this->slices_,&this->cached_slice_);
    }
    uVar4 = this->next_slice_size_ * 2;
    if (this->maximum_slice_size_ <= uVar4) {
      uVar4 = this->maximum_slice_size_;
    }
    this->next_slice_size_ = uVar4;
    pSVar2 = (this->slices_).
             super__Vector_base<protozero::ScatteredHeapBuffer::Slice,_std::allocator<protozero::ScatteredHeapBuffer::Slice>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    _Var3._M_head_impl =
         pSVar2[-1].buffer_._M_t.
         super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
         super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
         super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl;
    CVar6.end = _Var3._M_head_impl + pSVar2[-1].size_;
    CVar6.begin = _Var3._M_head_impl;
    return CVar6;
  }
  GetNewBuffer();
  pSVar2 = (this->slices_).
           super__Vector_base<protozero::ScatteredHeapBuffer::Slice,_std::allocator<protozero::ScatteredHeapBuffer::Slice>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  puVar5 = extraout_RDX;
  if ((this->slices_).
      super__Vector_base<protozero::ScatteredHeapBuffer::Slice,_std::allocator<protozero::ScatteredHeapBuffer::Slice>_>
      ._M_impl.super__Vector_impl_data._M_start != pSVar2) {
    puVar5 = (this->writer_->cur_range_).end + -(long)this->writer_->write_ptr_;
    pSVar2[-1].unused_bytes_ = (size_t)puVar5;
  }
  CVar7.end = puVar5;
  CVar7.begin = (uint8_t *)pSVar2;
  return CVar7;
}

Assistant:

protozero::ContiguousMemoryRange ScatteredHeapBuffer::GetNewBuffer() {
  PERFETTO_CHECK(writer_);
  AdjustUsedSizeOfCurrentSlice();

  if (cached_slice_.start()) {
    slices_.push_back(std::move(cached_slice_));
    PERFETTO_DCHECK(!cached_slice_.start());
  } else {
    slices_.emplace_back(next_slice_size_);
  }
  next_slice_size_ = std::min(maximum_slice_size_, next_slice_size_ * 2);
  return slices_.back().GetTotalRange();
}